

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

size_t __thiscall
proto2_unittest::TestHugeFieldNumbersLite::ByteSizeLong(TestHugeFieldNumbersLite *this)

{
  RepeatedField<int> *this_00;
  uint32_t uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  undefined8 *puVar9;
  uint uVar10;
  long *plVar11;
  
  sVar5 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  this_00 = &(this->field_0)._impl_.repeated_int32_;
  sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(this_00);
  uVar4 = google::protobuf::internal::SooRep::size
                    (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  sVar7 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_int32_,5,
                     &(this->field_0)._impl_._packed_int32_cached_byte_size_);
  uVar10 = *(uint *)((long)&this->field_0 + 0x50);
  uVar8 = (ulong)uVar10;
  if (uVar10 == *(uint *)((long)&this->field_0 + 0x4c)) {
    uVar8 = 0;
    plVar11 = (long *)0x0;
  }
  else {
    plVar11 = *(long **)(*(long *)((long)&this->field_0 + 0x58) + uVar8 * 8);
    if (plVar11 == (long *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  sVar5 = sVar6 + sVar5 + sVar7 + ((ulong)*(uint *)((long)&this->field_0 + 0x48) + (ulong)uVar4) * 5
  ;
  while (plVar11 != (long *)0x0) {
    sVar6 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar11 + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar11 + 5));
    plVar11 = (long *)*plVar11;
    if (plVar11 == (long *)0x0) {
      do {
        uVar10 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar10;
        if (*(uint *)((long)&this->field_0 + 0x4c) <= uVar10) {
          plVar11 = (long *)0x0;
          uVar8 = 0;
          break;
        }
        plVar11 = *(long **)(*(long *)((long)&this->field_0 + 0x58) + (ulong)uVar10 * 8);
      } while (plVar11 == (long *)0x0);
    }
    sVar5 = sVar5 + sVar6;
  }
  uVar10 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar10 & 0x7f) != 0) {
    if ((uVar10 & 1) != 0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar2 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 5;
    }
    if ((uVar10 & 2) != 0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar2 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 5;
    }
    if ((uVar10 & 4) != 0) {
      sVar6 = ForeignMessageLite::ByteSizeLong((this->field_0)._impl_.optional_message_);
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 5;
    }
    if ((uVar10 & 8) != 0) {
      sVar6 = TestHugeFieldNumbersLite_OptionalGroup::ByteSizeLong
                        ((this->field_0)._impl_.optionalgroup_);
      sVar5 = sVar5 + sVar6 + 10;
    }
    if ((uVar10 & 0x10) != 0) {
      uVar8 = (long)(this->field_0)._impl_.optional_int32_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 5;
    }
    if ((uVar10 & 0x20) != 0) {
      uVar8 = (long)(this->field_0)._impl_.fixed_32_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 5;
    }
    if ((uVar10 & 0x40) != 0) {
      uVar8 = (long)(this->field_0)._impl_.optional_enum_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 5;
    }
  }
  uVar1 = (this->field_0)._impl_._oneof_case_[0];
  switch(uVar1) {
  case 0x1ffffc7b:
    uVar10 = *(uint *)((long)&this->field_0 + 0x98) | 1;
    iVar3 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    uVar8 = 6;
    if (uVar1 == 0x1ffffc7b) {
      uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 5);
    }
    sVar5 = sVar5 + uVar8;
    goto switchD_001c8aa7_default;
  case 0x1ffffc7c:
    sVar6 = TestAllTypesLite::ByteSizeLong
                      ((this->field_0)._impl_.oneof_field_.oneof_test_all_types_);
    goto LAB_001c8b07;
  case 0x1ffffc7d:
    if (uVar1 == 0x1ffffc7d) goto LAB_001c8aea;
LAB_001c8ada:
    puVar9 = &google::protobuf::internal::fixed_address_empty_string;
    break;
  case 0x1ffffc7e:
    if (uVar1 != 0x1ffffc7e) goto LAB_001c8ada;
LAB_001c8aea:
    puVar9 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_test_all_types_ & 0xfffffffffffffffc)
    ;
    break;
  default:
    goto switchD_001c8aa7_default;
  }
  sVar6 = puVar9[1];
LAB_001c8b07:
  uVar10 = (uint)sVar6 | 1;
  iVar3 = 0x1f;
  if (uVar10 != 0) {
    for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  sVar5 = sVar5 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 5;
switchD_001c8aa7_default:
  uVar8 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar8 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar5 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar5;
  }
  return sVar5;
}

Assistant:

::size_t TestHugeFieldNumbersLite::ByteSizeLong() const {
  const TestHugeFieldNumbersLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 536870002;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_repeated_int32());
      ::size_t tag_size = ::size_t{5} *
          ::_pbi::FromIntSize(this_._internal_repeated_int32_size());
      total_size += tag_size + data_size;
    }
    // repeated int32 packed_int32 = 536870003 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32(), 5,
              this_._impl_._packed_int32_cached_byte_size_);
    }
    // map<string, string> string_string_map = 536870010;
    {
      total_size +=
          5 * ::google::protobuf::internal::FromIntSize(this_._internal_string_string_map_size());
      for (const auto& entry : this_._internal_string_string_map()) {
        total_size += _pbi::MapEntryFuncs<std::string, std::string,
                                       _pbi::WireFormatLite::TYPE_STRING,
                                       _pbi::WireFormatLite::TYPE_STRING>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // string optional_string = 536870005;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // bytes optional_bytes = 536870006;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // .proto2_unittest.ForeignMessageLite optional_message = 536870007;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 5 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_message_);
    }
    // .proto2_unittest.TestHugeFieldNumbersLite.OptionalGroup optionalgroup = 536870008 [features = {
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 10 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
    // int32 optional_int32 = 536870000;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 5 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32());
    }
    // int32 fixed_32 = 536870001;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 5 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_fixed_32());
    }
    // .proto2_unittest.ForeignEnumLite optional_enum = 536870004;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 5 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_enum());
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 536870011;
    case kOneofUint32: {
      total_size += 5 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .proto2_unittest.TestAllTypesLite oneof_test_all_types = 536870012;
    case kOneofTestAllTypes: {
      total_size += 5 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_test_all_types_);
      break;
    }
    // string oneof_string = 536870013;
    case kOneofString: {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // bytes oneof_bytes = 536870014;
    case kOneofBytes: {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_oneof_bytes());
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}